

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O3

void device_stop_nes_common(NESAPU_INF *info)

{
  if (info->chip_fds != (void *)0x0) {
    NES_FDS_Destroy(info->chip_fds);
  }
  if (info->memory != (UINT8 *)0x0) {
    free(info->memory);
  }
  free(info);
  return;
}

Assistant:

static void device_stop_nes_common(NESAPU_INF* info)
{
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		NES_FDS_Destroy(info->chip_fds);
#endif
	if (info->memory != NULL)
		free(info->memory);
	
	free(info);
	return;
}